

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O2

void __thiscall PrimeExtractor::iterateVector(PrimeExtractor *this,long step)

{
  ulong __n;
  reference rVar1;
  
  __n = this->lastStep;
  while (__n = __n + step,
        __n < (ulong)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->primeCand,__n);
    *rVar1._M_p = *rVar1._M_p & ~rVar1._M_mask;
  }
  return;
}

Assistant:

void PrimeExtractor::iterateVector(long step)
{
  for(long i = this->lastStep + step; i < this->primeCand.size(); i = i + step) {
    this->primeCand[i] = false;
  }
  
}